

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QIBusAttribute>::emplace<QIBusAttribute>
          (QMovableArrayOps<QIBusAttribute> *this,qsizetype i,QIBusAttribute *args)

{
  QIBusAttribute **ppQVar1;
  qsizetype *pqVar2;
  QIBusAttribute *pQVar3;
  Data *pDVar4;
  QIBusAttribute *pQVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  undefined8 uVar10;
  quint32 qVar11;
  quint32 qVar12;
  quint32 qVar13;
  Data<QHashPrivate::Node<QString,_QDBusArgument>_> *__old_val_3;
  Data<QHashPrivate::Node<QString,_QDBusArgument>_> *__old_val_1;
  QTypedArrayData<char16_t> *__old_val;
  long in_FS_OFFSET;
  bool bVar14;
  QHash<QString,_QDBusArgument> QStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0011d74b:
    QStack_50.d = (Data *)0xaaaaaaaaaaaaaaaa;
    pDVar6 = (args->super_QIBusSerializable).name.d.d;
    pcVar7 = (args->super_QIBusSerializable).name.d.ptr;
    (args->super_QIBusSerializable).name.d.d = (Data *)0x0;
    (args->super_QIBusSerializable).name.d.ptr = (char16_t *)0x0;
    qVar8 = (args->super_QIBusSerializable).name.d.size;
    pDVar9 = (args->super_QIBusSerializable).attachments.d;
    (args->super_QIBusSerializable).name.d.size = 0;
    (args->super_QIBusSerializable).attachments.d = (Data *)0x0;
    local_48._0_4_ = args->type;
    local_48._4_4_ = args->value;
    uStack_40._0_4_ = args->start;
    uStack_40._4_4_ = args->end;
    bVar14 = (this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>.
             size != 0;
    QArrayDataPointer<QIBusAttribute>::detachAndGrow
              ((QArrayDataPointer<QIBusAttribute> *)this,(uint)(i == 0 && bVar14),1,
               (QIBusAttribute **)0x0,(QArrayDataPointer<QIBusAttribute> *)0x0);
    pQVar5 = (this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>.
             ptr;
    if (i == 0 && bVar14) {
      pQVar5[-1].super_QIBusSerializable.name.d.d = pDVar6;
      pQVar5[-1].super_QIBusSerializable.name.d.ptr = pcVar7;
      pQVar5[-1].super_QIBusSerializable.name.d.size = qVar8;
      pQVar5[-1].super_QIBusSerializable.attachments.d = pDVar9;
      pQVar5[-1].type = (undefined4)local_48;
      pQVar5[-1].value = local_48._4_4_;
      pQVar5[-1].start = (undefined4)uStack_40;
      pQVar5[-1].end = uStack_40._4_4_;
      ppQVar1 = &(this->super_QGenericArrayOps<QIBusAttribute>).
                 super_QArrayDataPointer<QIBusAttribute>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    else {
      pQVar3 = pQVar5 + i;
      memmove(pQVar3 + 1,pQVar5 + i,
              ((this->super_QGenericArrayOps<QIBusAttribute>).
               super_QArrayDataPointer<QIBusAttribute>.size - i) * 0x30);
      (pQVar3->super_QIBusSerializable).name.d.d = pDVar6;
      (pQVar3->super_QIBusSerializable).name.d.ptr = pcVar7;
      (pQVar3->super_QIBusSerializable).name.d.size = qVar8;
      (pQVar3->super_QIBusSerializable).attachments.d = pDVar9;
      pQVar3->type = (undefined4)local_48;
      pQVar3->value = local_48._4_4_;
      pQVar3->start = (undefined4)uStack_40;
      pQVar3->end = uStack_40._4_4_;
    }
    QStack_50.d = (Data *)0x0;
    pqVar2 = &(this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>
              .size;
    *pqVar2 = *pqVar2 + 1;
    QHash<QString,_QDBusArgument>::~QHash(&QStack_50);
  }
  else {
    if (((this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>.size
         == i) &&
       (pQVar5 = (this->super_QGenericArrayOps<QIBusAttribute>).
                 super_QArrayDataPointer<QIBusAttribute>.ptr,
       (pDVar4->super_QArrayData).alloc - i !=
       ((long)((long)pQVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      pDVar6 = (args->super_QIBusSerializable).name.d.d;
      (args->super_QIBusSerializable).name.d.d = (Data *)0x0;
      pQVar5[i].super_QIBusSerializable.name.d.d = pDVar6;
      pcVar7 = (args->super_QIBusSerializable).name.d.ptr;
      (args->super_QIBusSerializable).name.d.ptr = (char16_t *)0x0;
      pQVar5[i].super_QIBusSerializable.name.d.ptr = pcVar7;
      qVar8 = (args->super_QIBusSerializable).name.d.size;
      (args->super_QIBusSerializable).name.d.size = 0;
      pQVar5[i].super_QIBusSerializable.name.d.size = qVar8;
      pDVar9 = (args->super_QIBusSerializable).attachments.d;
      (args->super_QIBusSerializable).attachments.d = (Data *)0x0;
      pQVar5[i].super_QIBusSerializable.attachments.d = pDVar9;
      qVar11 = args->value;
      uVar10 = *(undefined8 *)&args->start;
      pQVar5 = pQVar5 + i;
      pQVar5->type = args->type;
      pQVar5->value = qVar11;
      *(undefined8 *)(&pQVar5->type + 2) = uVar10;
    }
    else {
      if ((i != 0) ||
         (pQVar5 = (this->super_QGenericArrayOps<QIBusAttribute>).
                   super_QArrayDataPointer<QIBusAttribute>.ptr,
         (QIBusAttribute *)
         ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar5))
      goto LAB_0011d74b;
      pDVar6 = (args->super_QIBusSerializable).name.d.d;
      (args->super_QIBusSerializable).name.d.d = (Data *)0x0;
      pQVar5[-1].super_QIBusSerializable.name.d.d = pDVar6;
      pcVar7 = (args->super_QIBusSerializable).name.d.ptr;
      (args->super_QIBusSerializable).name.d.ptr = (char16_t *)0x0;
      pQVar5[-1].super_QIBusSerializable.name.d.ptr = pcVar7;
      qVar8 = (args->super_QIBusSerializable).name.d.size;
      (args->super_QIBusSerializable).name.d.size = 0;
      pQVar5[-1].super_QIBusSerializable.name.d.size = qVar8;
      pDVar9 = (args->super_QIBusSerializable).attachments.d;
      (args->super_QIBusSerializable).attachments.d = (Data *)0x0;
      pQVar5[-1].super_QIBusSerializable.attachments.d = pDVar9;
      qVar11 = args->value;
      qVar12 = args->start;
      qVar13 = args->end;
      pQVar5[-1].type = args->type;
      pQVar5[-1].value = qVar11;
      pQVar5[-1].start = qVar12;
      pQVar5[-1].end = qVar13;
      ppQVar1 = &(this->super_QGenericArrayOps<QIBusAttribute>).
                 super_QArrayDataPointer<QIBusAttribute>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QIBusAttribute>).super_QArrayDataPointer<QIBusAttribute>
              .size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }